

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetDomainsByAliases
          (Registry *this,StringArray *aAliases,DomainArray *aRet,StringArray *aUnresolved)

{
  bool bVar1;
  __type_conflict1 _Var2;
  int iVar3;
  reference pvVar4;
  iterator __first;
  iterator __last;
  size_type sVar5;
  __normal_iterator<ot::commissioner::persistent_storage::Domain_*,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_>
  local_160;
  const_iterator local_158;
  int local_14c;
  undefined1 local_148 [8];
  Domain pred;
  DomainArray result;
  Network nwk;
  undefined1 local_98 [8];
  Domain dom;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  const_iterator __end2;
  const_iterator __begin2;
  StringArray *__range2;
  DomainArray domains;
  Status status;
  StringArray *aUnresolved_local;
  DomainArray *aRet_local;
  StringArray *aAliases_local;
  Registry *this_local;
  
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            *)&__range2);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(aAliases);
  alias = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(aAliases);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&alias);
    if (!bVar1) {
      local_160._M_current =
           (Domain *)
           std::
           vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
           ::end(aRet);
      __gnu_cxx::
      __normal_iterator<ot::commissioner::persistent_storage::Domain_const*,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>>
      ::__normal_iterator<ot::commissioner::persistent_storage::Domain*>
                ((__normal_iterator<ot::commissioner::persistent_storage::Domain_const*,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>>
                  *)&local_158,&local_160);
      __first = std::
                vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                ::begin((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                         *)&__range2);
      __last = std::
               vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
               ::end((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      *)&__range2);
      std::
      vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>
      ::
      insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Domain*,std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>>,void>
                ((vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>
                  *)aRet,local_158,
                 (__normal_iterator<ot::commissioner::persistent_storage::Domain_*,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_>
                  )__first._M_current,
                 (__normal_iterator<ot::commissioner::persistent_storage::Domain_*,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_>
                  )__last._M_current);
      sVar5 = std::
              vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ::size((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      *)&__range2);
      domains.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = sVar5 == 0;
LAB_00215e9e:
      this_local._7_1_ =
           domains.
           super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
      local_14c = 1;
LAB_00215eae:
      std::
      vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ::~vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 *)&__range2);
      return this_local._7_1_;
    }
    dom.mName.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end2);
    Domain::Domain((Domain *)local_98);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            dom.mName.field_2._8_8_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (anonymous_namespace)::ALIAS_THIS_abi_cxx11_);
    if (_Var2) {
      Network::Network((Network *)
                       &result.
                        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      domains.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           GetCurrentNetwork(this,(Network *)
                                  &result.
                                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (domains.
          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
        iVar3 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                          (this->mStorage,
                           (undefined1 *)
                           ((long)&result.
                                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),local_98)
        ;
        domains.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
             anon_unknown_0::MapStatus((Status)iVar3);
      }
      Network::~Network((Network *)
                        &result.
                         super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00215d53:
      if (domains.
          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
        std::
        vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ::push_back((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                     *)&__range2,(value_type *)local_98);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(aUnresolved,(value_type *)dom.mName.field_2._8_8_);
      }
      local_14c = 0;
    }
    else {
      std::
      vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ::vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                *)((long)&pred.mName.field_2 + 8));
      Domain::Domain((Domain *)local_148);
      std::__cxx11::string::operator=((string *)&pred,(string *)dom.mName.field_2._8_8_);
      iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x15])
                        (this->mStorage,local_148,(undefined1 *)((long)&pred.mName.field_2 + 8));
      domains.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           anon_unknown_0::MapStatus((Status)iVar3);
      if (domains.
          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
        sVar5 = std::
                vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                ::size((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        *)((long)&pred.mName.field_2 + 8));
        if (sVar5 == 1) {
          pvVar4 = std::
                   vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   ::front((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                            *)((long)&pred.mName.field_2 + 8));
          Domain::operator=((Domain *)local_98,pvVar4);
          goto LAB_00215d15;
        }
        sVar5 = std::
                vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                ::size((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        *)((long)&pred.mName.field_2 + 8));
        if (sVar5 < 2) goto LAB_00215d15;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(aUnresolved,(value_type *)dom.mName.field_2._8_8_);
        domains.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = kAmbiguity;
        local_14c = 6;
      }
      else {
LAB_00215d15:
        local_14c = 0;
      }
      Domain::~Domain((Domain *)local_148);
      std::
      vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ::~vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 *)((long)&pred.mName.field_2 + 8));
      if (local_14c == 0) goto LAB_00215d53;
    }
    Domain::~Domain((Domain *)local_98);
    if (local_14c != 0) {
      if (local_14c != 6) goto LAB_00215eae;
      goto LAB_00215e9e;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Registry::Status Registry::GetDomainsByAliases(const StringArray &aAliases, DomainArray &aRet, StringArray &aUnresolved)
{
    Registry::Status status;
    DomainArray      domains;

    for (const auto &alias : aAliases)
    {
        Domain dom;

        if (alias == ALIAS_THIS)
        {
            Network nwk;
            status = GetCurrentNetwork(nwk);
            if (status == Registry::Status::kSuccess)
            {
                status = MapStatus(mStorage->Get(nwk.mDomainId, dom));
            }
        }
        else
        {
            DomainArray result;
            Domain      pred;
            pred.mName = alias;
            status     = MapStatus(mStorage->Lookup(pred, result));
            if (status == Registry::Status::kSuccess)
            {
                if (result.size() == 1)
                {
                    dom = result.front();
                }
                else if (result.size() > 1)
                {
                    aUnresolved.push_back(alias);
                    ExitNow(status = Registry::Status::kAmbiguity);
                }
            }
        }
        if (status == Registry::Status::kSuccess)
        {
            domains.push_back(dom);
        }
        else
        {
            aUnresolved.push_back(alias);
        }
    }
    aRet.insert(aRet.end(), domains.begin(), domains.end());
    status = domains.size() > 0 ? Registry::Status::kSuccess : Registry::Status::kNotFound;
exit:
    return status;
}